

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestNamerTests.cpp
# Opt level: O0

void __thiscall
TEST_NamerTestGroup_UseSubDirectory_Test::testBody(TEST_NamerTestGroup_UseSubDirectory_Test *this)

{
  element_type *peVar1;
  shared_ptr<ApprovalTests::ApprovalNamer> namer;
  SubdirectoryDisposer subdirectory;
  SubdirectoryDisposer *this_00;
  allocator<char> local_d9;
  string local_d8 [8];
  allocator<char> *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  undefined1 local_b1 [33];
  string local_90 [71];
  allocator<char> local_49;
  string local_48 [16];
  string *in_stack_ffffffffffffffc8;
  string *in_stack_ffffffffffffffd0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>
  ::useApprovalsSubdirectory(in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>
  ::getDefaultNamer();
  peVar1 = std::
           __shared_ptr_access<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x118119);
  this_00 = (SubdirectoryDisposer *)local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  (*peVar1->_vptr_ApprovalNamer[2])(local_90,peVar1,local_b1 + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  anon_unknown.dwarf_12c7c::checkContains(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)(local_b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b1);
  std::shared_ptr<ApprovalTests::ApprovalNamer>::~shared_ptr
            ((shared_ptr<ApprovalTests::ApprovalNamer> *)0x1181d6);
  ApprovalTests::SubdirectoryDisposer::~SubdirectoryDisposer(this_00);
  return;
}

Assistant:

TEST(NamerTestGroup, UseSubDirectory)
{
    auto subdirectory = Approvals::useApprovalsSubdirectory("approved_files");
    auto namer = Approvals::getDefaultNamer();
    checkContains(namer->getApprovedFile(".txt"), "approved_files");
}